

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O1

void __thiscall QtMWidgets::ScrollAreaPrivate::updateWidgetPosition(ScrollAreaPrivate *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  LayoutDirection LVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QRect local_50;
  QRect local_40;
  
  LVar5 = QWidget::layoutDirection();
  lVar3 = *(long *)((this->super_AbstractScrollAreaPrivate).viewport + 0x20);
  local_50.x2 = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
  local_50.y2 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
  local_50.x1 = 0;
  local_50.y1 = 0;
  iVar1 = (this->super_AbstractScrollAreaPrivate).topLeftCorner.xp;
  iVar2 = (this->super_AbstractScrollAreaPrivate).topLeftCorner.yp;
  lVar3 = *(long *)((this->widget).wp.value + 0x20);
  local_40.x2 = *(int *)(lVar3 + 0x1c) - (iVar1 + *(int *)(lVar3 + 0x14));
  local_40.y2 = *(int *)(lVar3 + 0x20) - (iVar2 + *(int *)(lVar3 + 0x18));
  local_40.y1 = -iVar2;
  local_40.x1 = -iVar1;
  uVar6 = QStyle::visualRect(LVar5,&local_50,&local_40);
  lVar3 = *(long *)((this->widget).wp.value + 0x20);
  local_40.x1 = (*(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14)) + 1;
  local_40.y1 = (*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1;
  lVar3 = *(long *)((this->super_AbstractScrollAreaPrivate).viewport + 0x20);
  local_50.x2 = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
  local_50.y2 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
  local_50.x1 = 0;
  local_50.y1 = 0;
  uVar7 = QStyle::alignedRect(LVar5,(this->alignment).i,&local_40,&local_50);
  lVar3 = *(long *)((this->widget).wp.value + 0x20);
  lVar4 = *(long *)((this->super_AbstractScrollAreaPrivate).viewport + 0x20);
  local_50.x1 = (int)uVar6;
  if ((*(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14)) + 1 <
      (*(int *)(lVar4 + 0x1c) - *(int *)(lVar4 + 0x14)) + 1) {
    local_50.x1 = (int)uVar7;
  }
  lVar3 = *(long *)((this->widget).wp.value + 0x20);
  if ((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1 <
      (*(int *)(lVar4 + 0x20) - *(int *)(lVar4 + 0x18)) + 1) {
    uVar6 = uVar7;
  }
  local_50.y1 = (int)((ulong)uVar6 >> 0x20);
  QWidget::move((QPoint *)(this->widget).wp.value);
  return;
}

Assistant:

void
ScrollAreaPrivate::updateWidgetPosition()
{
	ScrollArea * q = q_func();

	const Qt::LayoutDirection dir = q->layoutDirection();

	const QRect scrolled = QStyle::visualRect( dir, viewport->rect(),
		QRect( QPoint( -topLeftCorner.x(), -topLeftCorner.y() ), widget->size() ) );
	const QRect aligned = QStyle::alignedRect( dir, alignment, widget->size(),
		viewport->rect() );

	widget->move( widget->width() < viewport->width() ? aligned.x() : scrolled.x(),
		widget->height() < viewport->height() ? aligned.y() : scrolled.y() );
}